

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

CURLcode Curl_http2_setup(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  HTTP *pHVar2;
  Curl_handler *pCVar3;
  int iVar4;
  Curl_handler *pCVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr *p_Var6;
  CURLcode CVar7;
  char *fmt;
  nghttp2_session_callbacks *local_30;
  
  pHVar2 = (data->req).p.http;
  pHVar2->stream_id = -1;
  Curl_dyn_init(&pHVar2->header_recvbuf,0x20000);
  Curl_dyn_init(&pHVar2->trailer_recvbuf,0x20000);
  pHVar2->upload_mem = (uint8_t *)0x0;
  pHVar2->upload_len = 0;
  pHVar2->upload_left = 0;
  pHVar2->mem = (data->state).buffer;
  pHVar2->len = (ulong)(data->set).buffer_size;
  data->multi->recheckstate = true;
  pCVar3 = conn->handler;
  pCVar5 = &Curl_handler_http2_ssl;
  if (pCVar3 == &Curl_handler_http2 || pCVar3 == &Curl_handler_http2_ssl) {
    return CURLE_OK;
  }
  if ((pCVar3->flags & 1) == 0) {
    pCVar5 = &Curl_handler_http2;
  }
  conn->handler = pCVar5;
  if ((conn->proto).ftpc.pp.sendbuf.leng == 0) {
    p_Var6 = (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)(*Curl_cmalloc)(0x8000);
    (conn->proto).ftpc.pp.statemachine = p_Var6;
    if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
      iVar4 = nghttp2_session_callbacks_new(&local_30);
      if (iVar4 == 0) {
        nghttp2_session_callbacks_set_send_callback(local_30,send_callback);
        nghttp2_session_callbacks_set_on_frame_recv_callback(local_30,on_frame_recv);
        nghttp2_session_callbacks_set_on_data_chunk_recv_callback(local_30,on_data_chunk_recv);
        nghttp2_session_callbacks_set_on_stream_close_callback(local_30,on_stream_close);
        nghttp2_session_callbacks_set_on_begin_headers_callback(local_30,on_begin_headers);
        nghttp2_session_callbacks_set_on_header_callback(local_30,on_header);
        nghttp2_session_callbacks_set_error_callback(local_30,error_callback);
        iVar4 = nghttp2_session_client_new(&(conn->proto).httpc.h2,local_30,conn);
        nghttp2_session_callbacks_del(local_30);
        if (iVar4 == 0) goto LAB_005d37af;
        fmt = "Couldn\'t initialize nghttp2";
      }
      else {
        fmt = "Couldn\'t initialize nghttp2 callbacks";
      }
      Curl_failf(data,fmt);
    }
    Curl_dyn_free(&pHVar2->header_recvbuf);
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_005d37af:
    CVar7 = CURLE_OK;
    Curl_infof(data,"Using HTTP2, server supports multiplexing");
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 | 1;
    conn->httpversion = '\x14';
    conn->bundle->multiuse = 2;
    (conn->proto).ftpc.dirs = (char **)0x0;
    (conn->proto).ftpc.pp.endofresp =
         (_func__Bool_Curl_easy_ptr_connectdata_ptr_char_ptr_size_t_int_ptr *)0x0;
    (conn->proto).ftpc.entrypath = (char *)0x0;
    (conn->proto).httpc.pause_stream_id = 0;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_http2_setup(struct Curl_easy *data,
                          struct connectdata *conn)
{
  CURLcode result;
  struct http_conn *httpc = &conn->proto.httpc;
  struct HTTP *stream = data->req.p.http;

  DEBUGASSERT(data->state.buffer);

  stream->stream_id = -1;

  Curl_dyn_init(&stream->header_recvbuf, DYN_H2_HEADERS);
  Curl_dyn_init(&stream->trailer_recvbuf, DYN_H2_TRAILERS);

  stream->upload_left = 0;
  stream->upload_mem = NULL;
  stream->upload_len = 0;
  stream->mem = data->state.buffer;
  stream->len = data->set.buffer_size;

  multi_connchanged(data->multi);
  /* below this point only connection related inits are done, which only needs
     to be done once per connection */

  if((conn->handler == &Curl_handler_http2_ssl) ||
     (conn->handler == &Curl_handler_http2))
    return CURLE_OK; /* already done */

  if(conn->handler->flags & PROTOPT_SSL)
    conn->handler = &Curl_handler_http2_ssl;
  else
    conn->handler = &Curl_handler_http2;

  result = http2_init(data, conn);
  if(result) {
    Curl_dyn_free(&stream->header_recvbuf);
    return result;
  }

  infof(data, "Using HTTP2, server supports multiplexing");

  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->httpversion = 20;
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;

  httpc->inbuflen = 0;
  httpc->nread_inbuf = 0;

  httpc->pause_stream_id = 0;
  httpc->drain_total = 0;

  return CURLE_OK;
}